

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcSim.c
# Opt level: O2

void Wlc_NtkSimulatePrint(Wlc_Ntk_t *p,Vec_Int_t *vNodes,Vec_Ptr_t *vRes,int nWords,int nFrames)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  void *pvVar4;
  uint uVar5;
  int i;
  uint uVar6;
  int iVar7;
  
  if (nWords < 1) {
    nWords = 0;
  }
  if (nFrames < 1) {
    nFrames = 0;
  }
  uVar6 = 0;
  for (iVar7 = 0; iVar7 != nFrames; iVar7 = iVar7 + 1) {
    for (iVar1 = 0; iVar1 != nWords; iVar1 = iVar1 + 1) {
      uVar5 = uVar6 + 0x40;
      for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        for (i = 0; i < vNodes->nSize; i = i + 1) {
          iVar2 = Vec_IntEntry(vNodes,i);
          pWVar3 = Wlc_NtkObj(p,iVar2);
          for (iVar2 = pWVar3->End - pWVar3->Beg; 0 < iVar2 + 1; iVar2 = iVar2 + -1) {
            pvVar4 = Vec_VecEntryEntry((Vec_Vec_t *)vRes,i,iVar2);
            printf("%d",(ulong)((*(uint *)((long)pvVar4 + (long)((int)uVar6 >> 5) * 4) >>
                                 (uVar6 & 0x1f) & 1) != 0));
          }
          putchar(0x20);
        }
        putchar(10);
      }
      uVar6 = uVar5;
    }
    putchar(10);
  }
  return;
}

Assistant:

void Wlc_NtkSimulatePrint( Wlc_Ntk_t * p, Vec_Int_t * vNodes, Vec_Ptr_t * vRes, int nWords, int nFrames )
{
    Wlc_Obj_t * pWlcObj; 
    int f, w, b, i, k, iPat = 0;
    for ( f = 0; f < nFrames; f++, printf("\n") )
      for ( w = 0; w < nWords; w++ )
        for ( b = 0; b < 64; b++, iPat++, printf("\n") )
        {
            Wlc_NtkForEachObjVec( vNodes, p, pWlcObj, i )
            {
                int nBits = Wlc_ObjRange(pWlcObj);
                for ( k = nBits-1; k >= 0; k-- )
                {
                    word * pInfo = (word*)Vec_VecEntryEntry( (Vec_Vec_t *)vRes, i, k );
                    printf( "%d", Abc_InfoHasBit((unsigned *)pInfo, iPat) );
                }
                printf( " " );
            }
        }
}